

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O0

void __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test::testBody
          (TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test *local_10;
  TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"first");
  mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar2 = mock(local_40,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x21])();
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_50,"first");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_60,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_70,"first");
  pMVar2 = mock(&local_70,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(ulong)(uVar1 & 1),
             "LONGS_EQUAL(0, mock(\"first\").expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
             ,0x42,pTVar4);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x22])();
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"first");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_b0,"first");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,(ulong)(uVar1 & 1),
             "LONGS_EQUAL(1, mock(\"first\").expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
             ,0x46,pTVar4);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_c0,"first");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_c0);
  return;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchically)
{
    mock("first");

    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(1, mock("first").expectedCallsLeft());

    mock("first").clear();
}